

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime __thiscall QDateTime::toOffsetFromUtc(QDateTime *this,int offsetSeconds)

{
  long lVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  QTimeZone *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTimeZone::fromSecondsAheadOfUtc((int)((ulong)in_RSI >> 0x20));
  toTimeZone((QDateTime *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  QTimeZone::~QTimeZone((QTimeZone *)0x571f4e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDateTime)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::toOffsetFromUtc(int offsetSeconds) const
{
    return toTimeZone(QTimeZone::fromSecondsAheadOfUtc(offsetSeconds));
}